

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

int yaml_string_join(yaml_char_t **a_start,yaml_char_t **a_pointer,yaml_char_t **a_end,
                    yaml_char_t **b_start,yaml_char_t **b_pointer,yaml_char_t **b_end)

{
  int iVar1;
  size_t __n;
  
  iVar1 = 1;
  if (*b_start != *b_pointer) {
    do {
      __n = (long)*b_pointer - (long)*b_start;
      if ((long)__n < (long)*a_end - (long)*a_pointer) {
        memcpy(*a_pointer,*b_start,__n);
        *a_pointer = *a_pointer + ((long)*b_pointer - (long)*b_start);
        return 1;
      }
      iVar1 = yaml_string_extend(a_start,a_pointer,a_end);
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

YAML_DECLARE(int)
yaml_string_join(
        yaml_char_t **a_start, yaml_char_t **a_pointer, yaml_char_t **a_end,
        yaml_char_t **b_start, yaml_char_t **b_pointer, yaml_char_t **b_end)
{
    if (*b_start == *b_pointer)
        return 1;

    while (*a_end - *a_pointer <= *b_pointer - *b_start) {
        if (!yaml_string_extend(a_start, a_pointer, a_end))
            return 0;
    }

    memcpy(*a_pointer, *b_start, *b_pointer - *b_start);
    *a_pointer += *b_pointer - *b_start;

    return 1;
}